

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLReader::doInitDecode(XMLReader *this)

{
  XMLByte XVar1;
  uint uVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  int iVar5;
  XMLSize_t i;
  ulong uVar6;
  TranscodingException *pTVar7;
  ulong uVar8;
  uint uVar9;
  XMLSize_t XVar10;
  XMLSize_t XVar11;
  undefined1 *__s2;
  XMLByte *pXVar12;
  ArrayJanitor<char16_t> janValue;
  
  switch(this->fEncoding) {
  case EBCDIC:
    pXVar12 = this->fRawByteBuf;
    do {
      XVar3 = XMLEBCDICTranscoder::xlatThisOne(*pXVar12);
      this->fRawBufIndex = this->fRawBufIndex + 1;
      if (this->fCharsAvail == 0x3fff) {
        this->fCharsAvail = 0;
        this->fRawBufIndex = 0;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
        ArrayJanitor<char16_t>::ArrayJanitor(&janValue,this->fSystemId,this->fMemoryManager);
        pTVar7 = (TranscodingException *)__cxa_allocate_exception(0x30);
        TranscodingException::TranscodingException
                  (pTVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                   ,0x71f,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0,this->fMemoryManager);
        __cxa_throw(pTVar7,&TranscodingException::typeinfo,XMLException::~XMLException);
      }
      this->fCharSizeBuf[this->fCharsAvail] = '\x01';
      XVar11 = this->fCharsAvail;
      this->fCharsAvail = XVar11 + 1;
      this->fCharBuf[XVar11] = XVar3;
    } while ((XVar3 != L'>') && (pXVar12 = pXVar12 + 1, this->fRawBufIndex != this->fRawBytesAvail))
    ;
    break;
  case UCS_4B:
  case UCS_4L:
    if ((this->fRawByteBuf[3] == 0xff &&
         (this->fRawByteBuf[2] == 0xfe &&
         (this->fRawByteBuf[0] == '\0' && this->fRawByteBuf[1] == '\0'))) ||
       (((this->fRawByteBuf[1] == 0xfe && this->fRawByteBuf[0] == 0xff) &&
        this->fRawByteBuf[2] == '\0') && this->fRawByteBuf[3] == '\0')) {
      for (uVar6 = 0; uVar6 < this->fRawBytesAvail; uVar6 = uVar6 + 1) {
        this->fRawByteBuf[uVar6] = this->fRawByteBuf[uVar6 + 4];
      }
      this->fRawBytesAvail = this->fRawBytesAvail - 4;
    }
    pXVar12 = this->fRawByteBuf;
    do {
      if (this->fRawBytesAvail <= this->fRawBufIndex) break;
      uVar6 = this->fRawBufIndex + 4;
      if (this->fRawBytesAvail < uVar6) {
        this->fCharsAvail = 0;
        this->fRawBufIndex = 0;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
        ArrayJanitor<char16_t>::ArrayJanitor(&janValue,this->fSystemId,this->fMemoryManager);
        pTVar7 = (TranscodingException *)__cxa_allocate_exception(0x30);
        TranscodingException::TranscodingException
                  (pTVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                   ,0x609,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0,this->fMemoryManager);
        __cxa_throw(pTVar7,&TranscodingException::typeinfo,XMLException::~XMLException);
      }
      if (this->fCharsAvail == 0x3fff) {
        this->fCharsAvail = 0;
        this->fRawBufIndex = 0;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
        ArrayJanitor<char16_t>::ArrayJanitor(&janValue,this->fSystemId,this->fMemoryManager);
        pTVar7 = (TranscodingException *)__cxa_allocate_exception(0x30);
        TranscodingException::TranscodingException
                  (pTVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                   ,0x61a,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0,this->fMemoryManager);
        __cxa_throw(pTVar7,&TranscodingException::typeinfo,XMLException::~XMLException);
      }
      uVar9 = *(uint *)pXVar12;
      this->fRawBufIndex = uVar6;
      uVar2 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      if (this->fSwapped == false) {
        uVar2 = uVar9;
      }
      if (0xffff < uVar2) {
        this->fCharsAvail = 0;
        this->fRawBufIndex = 0;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
        ArrayJanitor<char16_t>::ArrayJanitor(&janValue,this->fSystemId,this->fMemoryManager);
        pTVar7 = (TranscodingException *)__cxa_allocate_exception(0x30);
        TranscodingException::TranscodingException
                  (pTVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                   ,0x633,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0,this->fMemoryManager);
        __cxa_throw(pTVar7,&TranscodingException::typeinfo,XMLException::~XMLException);
      }
      pXVar12 = pXVar12 + 4;
      this->fCharSizeBuf[this->fCharsAvail] = '\x04';
      XVar11 = this->fCharsAvail;
      this->fCharsAvail = XVar11 + 1;
      this->fCharBuf[XVar11] = (XMLCh)uVar2;
    } while (uVar2 != 0x3e);
    break;
  default:
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fSystemId);
    pTVar7 = (TranscodingException *)__cxa_allocate_exception(0x30);
    TranscodingException::TranscodingException
              (pTVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
               ,0x73a,Reader_BadAutoEncoding,this->fMemoryManager);
    __cxa_throw(pTVar7,&TranscodingException::typeinfo,XMLException::~XMLException);
  case UTF_8:
    pXVar12 = this->fRawByteBuf;
    if ((3 < this->fRawBytesAvail) &&
       (iVar5 = XMLString::compareNString((char *)pXVar12,(char *)&XMLRecognizer::fgUTF8BOM,3),
       iVar5 == 0)) {
      this->fRawBufIndex = this->fRawBufIndex + 3;
      pXVar12 = this->fRawByteBuf + 3;
    }
    if ((5 < this->fRawBytesAvail) &&
       (iVar5 = XMLString::compareNString((char *)pXVar12,"<?xml ",6), iVar5 == 0)) {
      while (this->fRawBufIndex < this->fRawBytesAvail) {
        XVar1 = *pXVar12;
        this->fRawBufIndex = this->fRawBufIndex + 1;
        if (this->fCharsAvail == 0x3fff) {
          this->fCharsAvail = 0;
          this->fRawBufIndex = 0;
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
          ArrayJanitor<char16_t>::ArrayJanitor(&janValue,this->fSystemId,this->fMemoryManager);
          pTVar7 = (TranscodingException *)__cxa_allocate_exception(0x30);
          TranscodingException::TranscodingException
                    (pTVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                     ,0x677,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0
                     ,(XMLCh *)0x0,this->fMemoryManager);
          __cxa_throw(pTVar7,&TranscodingException::typeinfo,XMLException::~XMLException);
        }
        this->fCharSizeBuf[this->fCharsAvail] = '\x01';
        XVar11 = this->fCharsAvail;
        this->fCharsAvail = XVar11 + 1;
        this->fCharBuf[XVar11] = (short)(char)XVar1;
        if (XVar1 == '>') break;
        pXVar12 = pXVar12 + 1;
        if ((char)XVar1 < '\0') {
          this->fCharsAvail = 0;
          this->fRawBufIndex = 0;
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
          ArrayJanitor<char16_t>::ArrayJanitor(&janValue,this->fSystemId,this->fMemoryManager);
          pTVar7 = (TranscodingException *)__cxa_allocate_exception(0x30);
          TranscodingException::TranscodingException
                    (pTVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                     ,0x693,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0
                     ,(XMLCh *)0x0,this->fMemoryManager);
          __cxa_throw(pTVar7,&TranscodingException::typeinfo,XMLException::~XMLException);
        }
      }
    }
    break;
  case UTF_16B:
  case UTF_16L:
    if (1 < this->fRawBytesAvail) {
      XVar11 = this->fRawBufIndex;
      pXVar12 = this->fRawByteBuf + XVar11;
      if ((*(ushort *)pXVar12 == 0xfffe) || (*(ushort *)pXVar12 == 0xfeff)) {
        XVar10 = XVar11 + 2;
        this->fRawBufIndex = XVar10;
        pXVar12 = this->fRawByteBuf + XVar11 + 2;
        XVar11 = XVar10;
      }
      else {
        XVar10 = 0;
      }
      if (0xb < this->fRawBytesAvail - XVar11) {
        if (this->fEncoding == UTF_16B) {
          __s2 = XMLRecognizer::fgUTF16BPre;
        }
        else {
          __s2 = XMLRecognizer::fgUTF16LPre;
        }
        iVar5 = bcmp(pXVar12,__s2,0xc);
        if (iVar5 == 0) {
          do {
            if (this->fRawBytesAvail <= this->fRawBufIndex) break;
            uVar6 = this->fRawBufIndex + 2;
            if (this->fRawBytesAvail < uVar6) {
              this->fCharsAvail = 0;
              this->fRawBufIndex = 0;
              (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
              (*this->fMemoryManager->_vptr_MemoryManager[4])
                        (this->fMemoryManager,this->fEncodingStr);
              ArrayJanitor<char16_t>::ArrayJanitor(&janValue,this->fSystemId,this->fMemoryManager);
              pTVar7 = (TranscodingException *)__cxa_allocate_exception(0x30);
              TranscodingException::TranscodingException
                        (pTVar7,
                         "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                         ,0x6da,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,
                         (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
              __cxa_throw(pTVar7,&TranscodingException::typeinfo,XMLException::~XMLException);
            }
            if (this->fCharsAvail == 0x3fff) {
              this->fCharsAvail = 0;
              this->fRawBufIndex = 0;
              (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
              (*this->fMemoryManager->_vptr_MemoryManager[4])
                        (this->fMemoryManager,this->fEncodingStr);
              ArrayJanitor<char16_t>::ArrayJanitor(&janValue,this->fSystemId,this->fMemoryManager);
              pTVar7 = (TranscodingException *)__cxa_allocate_exception(0x30);
              TranscodingException::TranscodingException
                        (pTVar7,
                         "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                         ,0x6eb,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,
                         (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
              __cxa_throw(pTVar7,&TranscodingException::typeinfo,XMLException::~XMLException);
            }
            XVar3 = *(XMLCh *)pXVar12;
            pXVar12 = pXVar12 + 2;
            this->fRawBufIndex = uVar6;
            XVar4 = XVar3 << 8 | (ushort)XVar3 >> 8;
            if (this->fSwapped == false) {
              XVar4 = XVar3;
            }
            this->fCharSizeBuf[this->fCharsAvail] = '\x02';
            XVar11 = this->fCharsAvail;
            this->fCharsAvail = XVar11 + 1;
            this->fCharBuf[XVar11] = XVar4;
          } while (XVar4 != L'>');
          break;
        }
      }
      this->fRawBufIndex = XVar10;
    }
  }
  if ((this->fType == Type_PE) && (this->fRefFrom == RefFrom_NonLiteral)) {
    XVar11 = this->fCharsAvail;
    this->fCharsAvail = XVar11 + 1;
    this->fCharBuf[XVar11] = L' ';
  }
  if (this->fCalculateSrcOfs == true) {
    this->fCharOfsBuf[0] = 0;
    uVar6 = this->fCharsAvail;
    uVar9 = 0;
    uVar8 = 0;
    while (uVar8 + 1 < uVar6) {
      uVar9 = uVar9 + this->fCharSizeBuf[uVar8];
      this->fCharOfsBuf[uVar8 + 1] = uVar9;
      uVar8 = uVar8 + 1;
    }
  }
  return;
}

Assistant:

void XMLReader::doInitDecode()
{
    switch(fEncoding)
    {
        case XMLRecognizer::UCS_4B :
        case XMLRecognizer::UCS_4L :
        {
            // Remove bom if any
            if (((fRawByteBuf[0] == 0x00) && (fRawByteBuf[1] == 0x00) && (fRawByteBuf[2] == 0xFE) && (fRawByteBuf[3] == 0xFF)) ||
                ((fRawByteBuf[0] == 0xFF) && (fRawByteBuf[1] == 0xFE) && (fRawByteBuf[2] == 0x00) && (fRawByteBuf[3] == 0x00))  )
            {
                for (XMLSize_t i = 0; i < fRawBytesAvail; i++)
                    fRawByteBuf[i] = fRawByteBuf[i+4];

                fRawBytesAvail -=4;
            }

            // Look at the raw buffer as UCS4 chars
            const UCS4Ch* asUCS = reinterpret_cast<const UCS4Ch*>(fRawByteBuf);

            while (fRawBufIndex < fRawBytesAvail)
            {
                // Make sure there are at least sizeof(UCS4Ch) bytes to consume.
                if (fRawBufIndex + sizeof(UCS4Ch) > fRawBytesAvail) {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }

                // Make sure we don't exhaust the limited prolog buffer size.
                // Leave room for a space added at the end of this function.
                if (fCharsAvail == kCharBufSize - 1) {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }

                // Get out the current 4 byte value and inc our raw buf index
                UCS4Ch curVal = *asUCS++;
                fRawBufIndex += sizeof(UCS4Ch);

                // Swap if that is required for this machine
                if (fSwapped)
                    curVal = BitOps::swapBytes(curVal);

                // Make sure its at least semi legal. If not, undo and throw
                if (curVal > 0xFFFF)
                {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }

                // Convert the value to an XML char and store it
                fCharSizeBuf[fCharsAvail] = 4;
                fCharBuf[fCharsAvail++] = XMLCh(curVal);

                // Break out on the > character
                if (curVal == chCloseAngle)
                    break;
            }
            break;
        }

        case XMLRecognizer::UTF_8 :
        {
            // If there's a utf-8 BOM  (0xEF 0xBB 0xBF), skip past it.
            //   Don't move to char buf - no one wants to see it.
            //   Note: this causes any encoding= declaration to override
            //         the BOM's attempt to say that the encoding is utf-8.

            // Look at the raw buffer as short chars
            const char* asChars = (const char*)fRawByteBuf;

            if (fRawBytesAvail > XMLRecognizer::fgUTF8BOMLen &&
                XMLString::compareNString(  asChars
                                            , XMLRecognizer::fgUTF8BOM
                                            , XMLRecognizer::fgUTF8BOMLen) == 0)
            {
                fRawBufIndex += XMLRecognizer::fgUTF8BOMLen;
                asChars      += XMLRecognizer::fgUTF8BOMLen;
            }

            //
            //  First check that there are enough bytes to even see the
            //  decl indentifier. If not, get out now with no action since
            //  there is no decl.
            //
            if (fRawBytesAvail < XMLRecognizer::fgASCIIPreLen)
                break;

            // Check for the opening sequence. If not, then no decl
            if (XMLString::compareNString(  asChars
                                            , XMLRecognizer::fgASCIIPre
                                            , XMLRecognizer::fgASCIIPreLen))
            {
                break;
            }

            while (fRawBufIndex < fRawBytesAvail)
            {
                const char curCh = *asChars++;
                fRawBufIndex++;

                // Make sure we don't exhaust the limited prolog buffer size.
                // Leave room for a space added at the end of this function.
                if (fCharsAvail == kCharBufSize - 1) {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }

                // Looks ok, so store it
                fCharSizeBuf[fCharsAvail] = 1;
                fCharBuf[fCharsAvail++] = XMLCh(curCh);

                // Break out on a > character
                if (curCh == chCloseAngle)
                    break;

                //
                //  A char greater than 0x7F is not allowed in this case. If
                //  so, undo and throw.
                //
                if (curCh & 0x80)
                {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }
            }
            break;
        }

        case XMLRecognizer::UTF_16B :
        case XMLRecognizer::UTF_16L :
        {
            //
            //  If there is a decl here, we just truncate back the characters
            //  as we go. No surrogate creation would be allowed here in legal
            //  XML, so we consider it a transoding error if we find one.
            //
            if (fRawBytesAvail < 2)
                break;

            XMLSize_t postBOMIndex = 0;
            const UTF16Ch* asUTF16 = reinterpret_cast<const UTF16Ch*>(&fRawByteBuf[fRawBufIndex]);
            if ((*asUTF16 == chUnicodeMarker) || (*asUTF16 == chSwappedUnicodeMarker))
            {
                fRawBufIndex += sizeof(UTF16Ch);
                asUTF16++;
                postBOMIndex = fRawBufIndex;
            }

            //  First check that there are enough raw bytes for there to even
            //  be a decl indentifier. If not, then nothing to do.
            //
            if (fRawBytesAvail - fRawBufIndex < XMLRecognizer::fgUTF16PreLen)
            {
                fRawBufIndex = postBOMIndex;
                break;
            }

            //
            //  See we get a match on the prefix. If not, then reset and
            //  break out.
            //
            if (fEncoding == XMLRecognizer::UTF_16B)
            {
                if (memcmp(asUTF16, XMLRecognizer::fgUTF16BPre, XMLRecognizer::fgUTF16PreLen))
                {
                    fRawBufIndex = postBOMIndex;
                    break;
                }
            }
             else
            {
                if (memcmp(asUTF16, XMLRecognizer::fgUTF16LPre, XMLRecognizer::fgUTF16PreLen))
                {
                    fRawBufIndex = postBOMIndex;
                    break;
                }
            }

            while (fRawBufIndex < fRawBytesAvail)
            {
                // Make sure there are at least sizeof(UTF16Ch) bytes to consume.
                if (fRawBufIndex + sizeof(UTF16Ch) > fRawBytesAvail) {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }

                // Make sure we don't exhaust the limited prolog buffer size.
                // Leave room for a space added at the end of this function.
                if (fCharsAvail == kCharBufSize - 1) {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }

                // Get out the current 2 byte value
                UTF16Ch curVal = *asUTF16++;
                fRawBufIndex += sizeof(UTF16Ch);

                // Swap if that is required for this machine
                if (fSwapped)
                    curVal = BitOps::swapBytes(curVal);

                //
                //  Store it and bump the target index, implicitly converting
                //  if UTF16Ch and XMLCh are not the same size.
                //
                fCharSizeBuf[fCharsAvail] = 2;
                fCharBuf[fCharsAvail++] = curVal;

                // Break out on a > char
                if (curVal == chCloseAngle)
                    break;
            }
            break;
        }

        case XMLRecognizer::EBCDIC :
        {
            //
            //  We use special support in the intrinsic EBCDIC-US transcoder
            //  to go through one char at a time.
            //
            const XMLByte* srcPtr = fRawByteBuf;
            while (1)
            {
                // Transcode one char from the source
                const XMLCh chCur = XMLEBCDICTranscoder::xlatThisOne(*srcPtr++);
                fRawBufIndex++;

                // Make sure we don't exhaust the limited prolog buffer size.
                // Leave room for a space added at the end of this function.
                if (fCharsAvail == kCharBufSize - 1) {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }


                //
                //  And put it into the character buffer. This stuff has to
                //  look like it was normally transcoded.
                //
                fCharSizeBuf[fCharsAvail] = 1;
                fCharBuf[fCharsAvail++] = chCur;

                // If its a > char, then break out
                if (chCur == chCloseAngle)
                    break;

                // Watch for using up all input and get out
                if (fRawBufIndex == fRawBytesAvail)
                    break;
            }
            break;
        }

        default :
            // It should never be anything else here
            fMemoryManager->deallocate(fPublicId);
            fMemoryManager->deallocate(fEncodingStr);
            fMemoryManager->deallocate(fSystemId);
            ThrowXMLwithMemMgr(TranscodingException, XMLExcepts::Reader_BadAutoEncoding, fMemoryManager);
            break;
    }

    //
    //  Ok, by the time we get here, if its a legal XML file we have eaten
    //  the XML/TextDecl. So, if we are a PE and are being referenced from
    //  outside a literal, then we need to throw in an arbitrary space that
    //  is required by XML.
    //
    if ((fType == Type_PE) && (fRefFrom == RefFrom_NonLiteral))
        fCharBuf[fCharsAvail++] = chSpace;

    //  Calculate fCharOfsBuf buffer using the elements from fCharBufSize
    if (fCalculateSrcOfs)
    {
        fCharOfsBuf[0] = 0;
        for (XMLSize_t index = 1; index < fCharsAvail; ++index) {
            fCharOfsBuf[index] = fCharOfsBuf[index-1]+fCharSizeBuf[index-1];
        }
    }
}